

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall gmlc::networking::TcpServer::logger(TcpServer *this,int logLevel,string *message)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)0x70b5d8);
  if (bVar1) {
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),in_RDI);
  }
  else if (in_ESI == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,in_RDX);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,in_RDX);
    std::operator<<(poVar2,'\n');
  }
  return;
}

Assistant:

void TcpServer::logger(int logLevel, const std::string& message)
{
    if (logFunction) {
        logFunction(logLevel, message);
    } else {
        if (logLevel == 0) {
            std::cerr << message << std::endl;
        } else {
            std::cout << message << '\n';
        }
    }
}